

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

TestCaseGroup *
deqp::egl::createCaseGroup<deqp::egl::UpdateResolutionCase>
          (EglTestContext *eglTestCtx,string *name,string *desc)

{
  TestCaseGroup *this;
  TestNode *node;
  long lVar1;
  allocator<char> local_170;
  allocator<char> local_16f;
  allocator<char> local_16e;
  allocator<char> local_16d;
  allocator<char> local_16c;
  allocator<char> local_16b;
  allocator<char> local_16a;
  allocator<char> local_169;
  undefined1 local_168 [64];
  undefined8 local_128;
  undefined8 uStack_120;
  string local_118 [32];
  string local_f8 [32];
  undefined8 local_d8;
  undefined8 uStack_d0;
  string local_c8 [32];
  string local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  string local_78 [32];
  string local_58 [32];
  undefined8 local_38;
  undefined8 uStack_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_168,"shrink",&local_169);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_168 + 0x20),"Shrink in both dimensions",&local_16a);
  local_128 = 0x8000000080;
  uStack_120 = 0x2000000020;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"grow",&local_16b);
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"Grow in both dimensions",&local_16c);
  local_d8 = 0x2000000020;
  uStack_d0 = 0x8000000080;
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"stretch_width",&local_16d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"Grow horizontally, shrink vertically",&local_16e);
  local_88 = 0x8000000020;
  uStack_80 = 0x2000000080;
  std::__cxx11::string::string<std::allocator<char>>(local_78,"stretch_height",&local_16f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Grow vertically, shrink horizontally",&local_170);
  local_38 = 0x2000000080;
  uStack_30 = 0x8000000020;
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,eglTestCtx,(name->_M_dataplus)._M_p,(desc->_M_dataplus)._M_p);
  for (lVar1 = 0; lVar1 != 0x140; lVar1 = lVar1 + 0x50) {
    node = (TestNode *)operator_new(0x1b48);
    UpdateResolutionCase::UpdateResolutionCase
              ((UpdateResolutionCase *)node,eglTestCtx,(ResizeParams *)(local_168 + lVar1));
    tcu::TestNode::addChild((TestNode *)this,node);
  }
  lVar1 = 0xf0;
  do {
    ResizeParams::~ResizeParams((ResizeParams *)(local_168 + lVar1));
    lVar1 = lVar1 + -0x50;
  } while (lVar1 != -0x50);
  return this;
}

Assistant:

TestCaseGroup* createCaseGroup(EglTestContext&	eglTestCtx,
							   const string&	name,
							   const string&	desc)
{
	const ResizeParams		params[]	=
	{
		{ "shrink",			"Shrink in both dimensions",
		  IVec2(128, 128),	IVec2(32, 32) },
		{ "grow",			"Grow in both dimensions",
		  IVec2(32, 32),	IVec2(128, 128) },
		{ "stretch_width",	"Grow horizontally, shrink vertically",
		  IVec2(32, 128),	IVec2(128, 32) },
		{ "stretch_height",	"Grow vertically, shrink horizontally",
		  IVec2(128, 32),	IVec2(32, 128) },
	};
	TestCaseGroup* const	group		=
		new TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str());

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(params); ++ndx)
		group->addChild(new Case(eglTestCtx, params[ndx]));

	return group;
}